

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

uv_handle_type uv_guess_handle(uv_file file)

{
  int iVar1;
  uint uVar2;
  int type;
  socklen_t len;
  sockaddr sa;
  stat s;
  int local_b0 [2];
  sockaddr local_a8;
  stat64 local_98;
  
  if (file < 0) {
    return UV_UNKNOWN_HANDLE;
  }
  iVar1 = isatty(file);
  if (iVar1 != 0) {
    return UV_TTY;
  }
  iVar1 = fstat64(file,&local_98);
  if (iVar1 == 0) {
    uVar2 = local_98.st_mode & 0xf000;
    if (uVar2 < 0x8000) {
      if (uVar2 == 0x1000) {
        return UV_NAMED_PIPE;
      }
      if (uVar2 == 0x2000) {
        return UV_FILE;
      }
    }
    else {
      if (uVar2 == 0x8000) {
        return UV_FILE;
      }
      if (uVar2 == 0xc000) {
        local_b0[1] = 4;
        iVar1 = getsockopt(file,1,3,local_b0,(socklen_t *)(local_b0 + 1));
        if (iVar1 == 0) {
          local_b0[1] = 0x10;
          iVar1 = getsockname(file,&local_a8,(socklen_t *)(local_b0 + 1));
          if (iVar1 == 0) {
            if (local_b0[0] == 1) {
              if ((local_a8.sa_family & 0xfff7) == 2) {
                return UV_TCP;
              }
              if (local_a8.sa_family == 1) {
                return UV_NAMED_PIPE;
              }
            }
            else if ((local_b0[0] == 2) && ((local_a8.sa_family & 0xfff7) == 2)) {
              return UV_UDP;
            }
          }
        }
      }
    }
  }
  return UV_UNKNOWN_HANDLE;
}

Assistant:

uv_handle_type uv_guess_handle(uv_file file) {
  struct sockaddr sa;
  struct stat s;
  socklen_t len;
  int type;

  if (file < 0)
    return UV_UNKNOWN_HANDLE;

  if (isatty(file))
    return UV_TTY;

  if (fstat(file, &s))
    return UV_UNKNOWN_HANDLE;

  if (S_ISREG(s.st_mode))
    return UV_FILE;

  if (S_ISCHR(s.st_mode))
    return UV_FILE;  /* XXX UV_NAMED_PIPE? */

  if (S_ISFIFO(s.st_mode))
    return UV_NAMED_PIPE;

  if (!S_ISSOCK(s.st_mode))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(type);
  if (getsockopt(file, SOL_SOCKET, SO_TYPE, &type, &len))
    return UV_UNKNOWN_HANDLE;

  len = sizeof(sa);
  if (getsockname(file, &sa, &len))
    return UV_UNKNOWN_HANDLE;

  if (type == SOCK_DGRAM)
    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_UDP;

  if (type == SOCK_STREAM) {
#if defined(_AIX) || defined(__DragonFly__)
    /* on AIX/DragonFly the getsockname call returns an empty sa structure
     * for sockets of type AF_UNIX.  For all other types it will
     * return a properly filled in structure.
     */
    if (len == 0)
      return UV_NAMED_PIPE;
#endif /* defined(_AIX) || defined(__DragonFly__) */

    if (sa.sa_family == AF_INET || sa.sa_family == AF_INET6)
      return UV_TCP;
    if (sa.sa_family == AF_UNIX)
      return UV_NAMED_PIPE;
  }

  return UV_UNKNOWN_HANDLE;
}